

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O3

qsizetype QtPrivate::count(QStringView haystack,QLatin1StringView needle,CaseSensitivity cs)

{
  QStringView needle_00;
  qsizetype qVar1;
  long in_FS_OFFSET;
  QVarLengthArray<char16_t,_256LL> s;
  QVarLengthArray<char16_t,_256LL> local_250;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  qVar1 = -1;
  if (needle.m_size <= haystack.m_size) {
    memset(&local_250,0xaa,0x218);
    qt_from_latin1_to_qvla(&local_250,needle);
    needle_00.m_data =
         (storage_type_conflict *)local_250.super_QVLABase<char16_t>.super_QVLABaseBase.ptr;
    needle_00.m_size = local_250.super_QVLABase<char16_t>.super_QVLABaseBase.s;
    qVar1 = count(haystack,needle_00,cs);
    if ((QVLAStorage<2UL,_2UL,_256LL> *)local_250.super_QVLABase<char16_t>.super_QVLABaseBase.ptr !=
        &local_250.super_QVLAStorage<2UL,_2UL,_256LL>) {
      sizedFree(local_250.super_QVLABase<char16_t>.super_QVLABaseBase.ptr,
                local_250.super_QVLABase<char16_t>.super_QVLABaseBase.a * 2);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return qVar1;
  }
  __stack_chk_fail();
}

Assistant:

qsizetype QtPrivate::count(QStringView haystack, QLatin1StringView needle, Qt::CaseSensitivity cs)
{
    if (haystack.size() < needle.size())
        return -1;

    QVarLengthArray<char16_t> s = qt_from_latin1_to_qvla(needle);
    return QtPrivate::count(haystack, QStringView(s.data(), s.size()), cs);
}